

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<const_char_*>::dup(Array<const_char_*> *this,int __fd)

{
  char **ppcVar1;
  char **in_RAX;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<const_char_*> local_18;
  
  if (*(int *)(this->_a + -1) != 1) {
    local_18._a = in_RAX;
    clone(&local_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    if (this->_a != local_18._a) {
      LOCK();
      ppcVar1 = this->_a + -1;
      *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
      UNLOCK();
      if (*(int *)ppcVar1 == 0) {
        free(this->_a + -2);
      }
      this->_a = (char **)local_18;
      LOCK();
      *(int *)(local_18._a + -1) = *(int *)(local_18._a + -1) + 1;
      UNLOCK();
    }
    LOCK();
    ppcVar1 = local_18._a + -1;
    *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
    UNLOCK();
    if (*(int *)ppcVar1 == 0) {
      free(local_18._a + -2);
    }
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}